

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::cMove(Forth *this)

{
  Char value;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_20;
  Cell i;
  CAddr src;
  CAddr dst;
  uint length;
  Forth *this_local;
  
  requireDStackDepth(this,3,"CMOVE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = dataSpaceAt(this,uVar3 + local_20);
    dataSpaceSet(this,uVar2 + local_20,value);
  }
  return;
}

Assistant:

void cMove() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(dst + i, dataSpaceAt(src + i));
			}
		}